

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O2

Promise<void> __thiscall
kj::newAdaptedPromise<void,kj::Canceler::AdapterImpl<void>,kj::Canceler&,kj::Promise<void>>
          (kj *this,Canceler *adapterConstructorParams,Promise<void> *adapterConstructorParams_1)

{
  AdapterPromiseNode<kj::_::Void,_kj::Canceler::AdapterImpl<void>_> *pAVar1;
  PromiseNode *extraout_RDX;
  Promise<void> PVar2;
  Own<kj::_::AdapterPromiseNode<kj::_::Void,_kj::Canceler::AdapterImpl<void>_>_> local_30;
  Own<kj::_::PromiseNode> local_20;
  
  heap<kj::_::AdapterPromiseNode<kj::_::Void,kj::Canceler::AdapterImpl<void>>,kj::Canceler&,kj::Promise<void>>
            ((kj *)&local_30,adapterConstructorParams,adapterConstructorParams_1);
  pAVar1 = local_30.ptr;
  local_20.disposer = local_30.disposer;
  local_30.ptr = (AdapterPromiseNode<kj::_::Void,_kj::Canceler::AdapterImpl<void>_> *)0x0;
  *(Disposer **)this = local_30.disposer;
  *(AdapterPromiseNode<kj::_::Void,_kj::Canceler::AdapterImpl<void>_> **)(this + 8) = pAVar1;
  local_20.ptr = (PromiseNode *)0x0;
  Own<kj::_::PromiseNode>::dispose(&local_20);
  Own<kj::_::AdapterPromiseNode<kj::_::Void,_kj::Canceler::AdapterImpl<void>_>_>::dispose(&local_30)
  ;
  PVar2.super_PromiseBase.node.ptr = extraout_RDX;
  PVar2.super_PromiseBase.node.disposer = (Disposer *)this;
  return (Promise<void>)PVar2.super_PromiseBase.node;
}

Assistant:

Promise<T> newAdaptedPromise(Params&&... adapterConstructorParams) {
  return Promise<T>(false, heap<_::AdapterPromiseNode<_::FixVoid<T>, Adapter>>(
      kj::fwd<Params>(adapterConstructorParams)...));
}